

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiver.cpp
# Opt level: O2

void __thiscall
MyClientConnection::OnData(MyClientConnection *this,uint32_t channel,uint8_t *data,uint32_t bytes)

{
  long lVar1;
  undefined1 auVar2 [16];
  TonkFile pTVar3;
  uint64_t uVar4;
  OutputWorker *pOVar5;
  uint64_t uVar6;
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [64];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  TonkStatusEx local_230;
  uint8_t ping_message [9];
  undefined3 uStack_1a7;
  ostringstream local_1a0 [376];
  undefined1 extraout_var [56];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar9 = in_ZMM0._0_16_;
  if (channel == 0x96) {
    pTVar3 = tonk_file_receive(this->File,data,bytes,OnData::anon_class_1_0_00000001::__invoke,this)
    ;
    this->File = pTVar3;
    uVar4 = tonk_time();
    pTVar3 = this->File;
    if ((pTVar3 != (TonkFile)0x0) && (1000000 < uVar4 - this->LastReportUsec)) {
      this->LastReportUsec = uVar4;
      auVar9 = vcvtusi2ss_avx512f(auVar9,pTVar3->TotalBytes);
      uVar6 = pTVar3->ProgressBytes;
      tonk::SDKConnection::GetStatusEx(&local_230,&this->super_SDKConnection);
      if ((int)Logger.ChannelMinLevel < 3) {
        auVar2 = vcvtusi2sd_avx512f(in_XMM1,local_230.IncomingBPS);
        ping_message[0] = (uint8_t)Logger.ChannelName;
        ping_message._1_7_ = (undefined7)((ulong)Logger.ChannelName >> 8);
        stack0xfffffffffffffe58 = Info;
        std::__cxx11::ostringstream::ostringstream(local_1a0);
        auVar8._8_8_ = extraout_XMM1_Qb;
        auVar8._0_8_ = extraout_XMM1_Qa;
        std::operator<<((ostream *)local_1a0,(string *)&Logger.Prefix);
        std::operator<<((ostream *)local_1a0,"File(");
        std::operator<<((ostream *)local_1a0,pTVar3->Name);
        std::operator<<((ostream *)local_1a0,") progress: ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
        std::operator<<((ostream *)local_1a0," / ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
        std::operator<<((ostream *)local_1a0," Bytes (");
        auVar8 = vcvtusi2ss_avx512f(auVar8,uVar6 * 100);
        std::ostream::operator<<((ostream *)local_1a0,auVar8._0_4_ / auVar9._0_4_);
        std::operator<<((ostream *)local_1a0,"%).  Incoming at ");
        std::ostream::_M_insert<double>(auVar2._0_8_ / 1000.0);
        std::operator<<((ostream *)local_1a0," KBPS");
        pOVar5 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar5,(LogStringBuffer *)ping_message);
        std::__cxx11::ostringstream::~ostringstream(local_1a0);
      }
      ping_message[0] = 'M';
      ping_message._1_7_ = (undefined7)uVar4;
      ping_message[8] = (uint8_t)(uVar4 >> 0x38);
      tonk::SDKConnection::Send(&this->super_SDKConnection,ping_message,9,0x33);
    }
  }
  else if (bytes == 0xc && channel == 0x33) {
    lVar1 = *(long *)(data + 1);
    uVar4 = tonk_time();
    uVar6 = tonk::SDKConnection::FromLocalTime23
                      (&this->super_SDKConnection,(uint)*(uint3 *)(data + 9));
    if ((int)Logger.ChannelMinLevel < 3) {
      ping_message[0] = (uint8_t)Logger.ChannelName;
      ping_message._1_7_ = (undefined7)((ulong)Logger.ChannelName >> 8);
      stack0xfffffffffffffe58 = Info;
      auVar7._0_8_ = std::__cxx11::ostringstream::ostringstream(local_1a0);
      auVar7._8_56_ = extraout_var;
      auVar9 = auVar7._0_16_;
      std::operator<<((ostream *)local_1a0,(string *)&Logger.Prefix);
      std::operator<<((ostream *)local_1a0,"Low-latency ping RTT = ");
      auVar9 = vcvtusi2ss_avx512f(auVar9,uVar4 - lVar1);
      std::ostream::operator<<((ostream *)local_1a0,auVar9._0_4_ / 1000.0);
      auVar9._8_8_ = extraout_XMM1_Qb_00;
      auVar9._0_8_ = extraout_XMM1_Qa_00;
      std::operator<<((ostream *)local_1a0," ms, OWD(remote2local) = ");
      auVar9 = vcvtusi2ss_avx512f(auVar9,uVar4 - uVar6);
      std::ostream::operator<<((ostream *)local_1a0,auVar9._0_4_ / 1000.0);
      std::operator<<((ostream *)local_1a0," ms");
      pOVar5 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar5,(LogStringBuffer *)ping_message);
      std::__cxx11::ostringstream::~ostringstream(local_1a0);
    }
  }
  return;
}

Assistant:

void MyClientConnection::OnData(
    uint32_t          channel,  // Channel number attached to each message by sender
    const uint8_t*       data,  // Pointer to a buffer containing the message data
    uint32_t            bytes   // Number of bytes in the message
)
{
    if (channel == TonkChannel_LowPri0)
    {
        File = tonk_file_receive(
            File,
            data,
            bytes,
            [](TonkFile file, void* context) -> int
        {
            MyClientConnection* thiz = reinterpret_cast<MyClientConnection*>(context);

            return thiz->OnFileDone(file);
        }, this);

        const uint64_t nowUsec = tonk_time();
        if (File && nowUsec - LastReportUsec > 1000000)
        {
            LastReportUsec = nowUsec;
            Logger.Info("File(", File->Name, ") progress: ", File->ProgressBytes, " / ", File->TotalBytes,
                " Bytes (", File->ProgressBytes * 100 / (float)File->TotalBytes,
                "%).  Incoming at ", GetStatusEx().IncomingBPS / 1000.0, " KBPS");

            // Periodically send a ping to demonstrate that data is still low-latency
            uint8_t ping_message[1 + 8];
            ping_message[0] = 77;
            tonk::WriteU64_LE(ping_message + 1, nowUsec);
            Send(ping_message, 9, TonkChannel_Reliable1);
        }
    }
    else if (channel == TonkChannel_Reliable1 && bytes == 1 + 8 + 3)
    {
        uint64_t pingUsec = tonk::ReadU64_LE(data + 1);
        uint64_t pongUsec = tonk_time();

        uint32_t compressedRemoteUsec = tonk::ReadU24_LE(data + 1 + 8);
        uint64_t remoteUsec = FromLocalTime23(compressedRemoteUsec);

        Logger.Info("Low-latency ping RTT = ", (pongUsec - pingUsec) / 1000.f, " ms, OWD(remote2local) = ", (pongUsec - remoteUsec) / 1000.f, " ms");
    }
}